

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printVersion(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"program info:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tname: ");
  poVar1 = std::operator<<(poVar1,"InferExamAnswers");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tdescription: ");
  poVar1 = std::operator<<(poVar1,
                           "Algorithms and Datastructures practicum 2 infer exam answers algorithm")
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tauthor: ");
  poVar1 = std::operator<<(poVar1,"Ties Klappe & Rowan Goemans");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tversion: ");
  poVar1 = std::operator<<(poVar1,"1.0.0-aedd537");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tmail: ");
  poVar1 = std::operator<<(poVar1,"R.Goemans@student.science.ru.nl");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\tcopyright: ");
  poVar1 = std::operator<<(poVar1,"Copyright (C) 2018 Ties Klappe & Rowan Goemans");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printVersion()
{
	std::cout
		<< "program info:" << std::endl
		<< "\tname: " << INFEREXAMANSWERS_NAME << std::endl
		<< "\tdescription: " << INFEREXAMANSWERS_DESCRIPTION << std::endl
		<< "\tauthor: " << INFEREXAMANSWERS_AUTHOR << std::endl
		<< "\tversion: " << INFEREXAMANSWERS_VERSION << std::endl
		<< "\tmail: " << INFEREXAMANSWERS_MAIL << std::endl
		<< "\tcopyright: " << INFEREXAMANSWERS_COPYRIGHT << std::endl;
}